

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmGeneratorTarget *dependee,
          cmListFileBacktrace *dependee_backtrace,bool linking,bool cross)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *psVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  int dependee_index;
  bool local_2e;
  bool local_2d;
  int local_2c;
  
  local_2e = cross;
  bVar2 = cmGeneratorTarget::IsInBuildSystem(dependee);
  if (!bVar2) {
    psVar4 = cmGeneratorTarget::GetUtilityItems(dependee);
    for (p_Var5 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      if (*(cmGeneratorTarget **)(p_Var5 + 2) != (cmGeneratorTarget *)0x0) {
        AddTargetDepend(this,depender_index,*(cmGeneratorTarget **)(p_Var5 + 2),
                        (cmListFileBacktrace *)&p_Var5[2]._M_left,false,
                        *(bool *)&p_Var5[2]._M_parent);
      }
    }
    return;
  }
  p_Var6 = (this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 != (_Base_ptr)0x0) {
    p_Var1 = &(this->TargetIndex)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (*(cmGeneratorTarget **)(p_Var6 + 1) >= dependee) {
        p_Var3 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(cmGeneratorTarget **)(p_Var6 + 1) < dependee];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (*(cmGeneratorTarget **)(p_Var3 + 1) <= dependee))
    {
      local_2c = *(int *)&p_Var3[1]._M_parent;
      local_2d = !linking;
      std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
      emplace_back<int&,bool,bool&,cmListFileBacktrace_const&>
                ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                 ((this->InitialGraph).
                  super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                  super__Vector_impl_data._M_start + depender_index),&local_2c,&local_2d,&local_2e,
                 dependee_backtrace);
      return;
    }
  }
  __assert_fail("tii != this->TargetIndex.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmComputeTargetDepends.cxx"
                ,0x19e,
                "void cmComputeTargetDepends::AddTargetDepend(int, const cmGeneratorTarget *, const cmListFileBacktrace &, bool, bool)"
               );
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(
  int depender_index, cmGeneratorTarget const* dependee,
  cmListFileBacktrace const& dependee_backtrace, bool linking, bool cross)
{
  if (!dependee->IsInBuildSystem()) {
    // Skip targets that are not in the buildsystem but follow their
    // utility dependencies.
    std::set<cmLinkItem> const& utils = dependee->GetUtilityItems();
    for (cmLinkItem const& i : utils) {
      if (cmGeneratorTarget const* transitive_dependee = i.Target) {
        this->AddTargetDepend(depender_index, transitive_dependee, i.Backtrace,
                              false, i.Cross);
      }
    }
  } else {
    // Lookup the index for this target.  All targets should be known by
    // this point.
    auto tii = this->TargetIndex.find(dependee);
    assert(tii != this->TargetIndex.end());
    int dependee_index = tii->second;

    // Add this entry to the dependency graph.
    this->InitialGraph[depender_index].emplace_back(dependee_index, !linking,
                                                    cross, dependee_backtrace);
  }
}